

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotor::IntToDescriptor
          (ChShaftsMotor *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  CoeffReturnType pdVar1;
  
  if (this->motor_mode != MOT_MODE_TORQUE) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L
                       );
    (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar1;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)off_L);
    (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar1;
  }
  return;
}

Assistant:

void ChShaftsMotor::IntToDescriptor(const unsigned int off_v,  // offset in v, R
                                    const ChStateDelta& v,
                                    const ChVectorDynamic<>& R,
                                    const unsigned int off_L,  // offset in L, Qc
                                    const ChVectorDynamic<>& L,
                                    const ChVectorDynamic<>& Qc) {
    if (motor_mode != MOT_MODE_TORQUE) {
        constraint.Set_l_i(L(off_L));

        constraint.Set_b_i(Qc(off_L));
    }
}